

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O3

void __thiscall json11::Json::Json(Json *this,string *value)

{
  undefined1 local_29;
  JsonString *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  local_28 = (JsonString *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<json11::JsonString,std::allocator<json11::JsonString>,std::__cxx11::string>
            (a_Stack_20,&local_28,(allocator<json11::JsonString> *)&local_29,value);
  (this->m_ptr).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_28;
  (this->m_ptr).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = a_Stack_20[0]._M_pi;
  return;
}

Assistant:

Json::Json(string &&value)             : m_ptr(make_shared<JsonString>(move(value))) {}